

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O1

void __thiscall ErrorCommand::~ErrorCommand(ErrorCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__ErrorCommand_00115418;
  pcVar2 = (this->cmd)._M_dataplus._M_p;
  paVar1 = &(this->cmd).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ErrorCommand() = default;